

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS
ref_part_bin_ugrid_cell
          (REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_GLOB nnode,FILE *file,
          REF_FILEPOS conn_offset,REF_FILEPOS faceid_offset,REF_BOOL swap_endian,
          REF_BOOL sixty_four_bit)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  REF_CELL ref_cell_00;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  clock_t cVar7;
  clock_t cVar8;
  FILE *pFVar9;
  REF_INT *pRVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  void *pvVar15;
  long *plVar16;
  undefined8 uVar17;
  ulong uVar18;
  ulong uVar19;
  REF_MPI ref_mpi;
  REF_MPI pRVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  REF_INT *pRVar25;
  REF_GLOB *pRVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  size_t __size;
  ulong uVar30;
  void *local_130;
  uint local_128;
  REF_INT elements_to_receive;
  ulong local_110;
  undefined4 *local_108;
  REF_GLOB *local_100;
  double local_f8;
  REF_INT *local_f0;
  long local_e8;
  long *local_e0;
  REF_MPI local_d8;
  FILE *local_d0;
  long local_c8;
  void *local_c0;
  ulong local_b8;
  long local_b0;
  int *local_a8;
  long local_a0;
  clock_t local_98;
  long local_90;
  REF_CELL local_88;
  REF_INT *local_80;
  REF_NODE local_78;
  REF_INT total_add;
  REF_INT total_mpi;
  REF_INT total;
  REF_INT end_of_message;
  long *local_60;
  REF_FILEPOS local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  ref_mpi = ref_node->ref_mpi;
  end_of_message = -1;
  uVar6 = ncell / (long)ref_mpi->n;
  uVar18 = 1000000;
  if (1000000 < (int)uVar6) {
    uVar18 = uVar6 & 0xffffffff;
  }
  local_f8 = (double)nnode;
  local_78 = ref_node;
  if ((1 < ref_mpi->timing) && (ref_mpi->id == 0)) {
    printf("chunk %d ncell %ld nproc %d\n",uVar18,ncell);
  }
  uVar4 = ref_cell->size_per * (int)uVar18;
  if ((int)uVar4 < 0) {
    pcVar24 = "malloc sent_c2n of REF_GLOB negative";
    uVar17 = 0x49c;
  }
  else {
    uVar1 = ref_cell->node_per;
    lVar29 = (long)(int)uVar1;
    sVar28 = (ulong)uVar4 << 3;
    local_110 = (long)ref_cell->size_per;
    local_d0 = (FILE *)file;
    local_80 = (REF_INT *)ncell;
    local_58 = conn_offset;
    local_100 = (REF_GLOB *)malloc(sVar28);
    uVar6 = local_110;
    if (local_100 == (REF_GLOB *)0x0) {
      pcVar24 = "malloc sent_c2n of REF_GLOB NULL";
      uVar17 = 0x49c;
LAB_0016f1e6:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_bin_ugrid_cell",pcVar24);
      return 2;
    }
    local_88 = ref_cell;
    if (ref_mpi->id != 0) {
      lVar29 = (long)local_f8 + -1;
      local_c8 = 0;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      local_c0 = (void *)(local_110 * 4);
      local_e8 = 0;
      do {
        cVar7 = clock();
        uVar4 = ref_mpi_scatter_recv(ref_mpi,&elements_to_receive,1,1);
        if (uVar4 != 0) {
          pcVar24 = "recv";
          uVar17 = 0x4f6;
          goto LAB_0016fb4a;
        }
        cVar8 = clock();
        local_e8 = local_e8 + (cVar8 - cVar7);
        if (0 < elements_to_receive) {
          local_b8 = clock();
          iVar5 = (int)local_110;
          uVar4 = ref_mpi_scatter_recv(ref_mpi,local_100,elements_to_receive * iVar5,2);
          if (uVar4 != 0) {
            pcVar24 = "send";
            uVar17 = 0x4fc;
            goto LAB_0016fb4a;
          }
          cVar7 = clock();
          pFVar9 = (FILE *)clock();
          local_108 = (undefined4 *)CONCAT44(local_108._4_4_,elements_to_receive);
          uVar4 = elements_to_receive * iVar5;
          if ((int)uVar4 < 0) {
            pcVar24 = "malloc sent_part of REF_INT negative";
            uVar17 = 0x501;
            goto LAB_0016f1b5;
          }
          local_d0 = pFVar9;
          pRVar10 = (REF_INT *)malloc((ulong)uVar4 * 4);
          if (pRVar10 == (REF_INT *)0x0) {
            uVar17 = 0x501;
            goto LAB_0016fbc9;
          }
          local_e8 = (local_e8 - local_b8) + cVar7;
          for (uVar18 = 0; uVar4 != uVar18; uVar18 = uVar18 + 1) {
            pRVar10[uVar18] = -1;
          }
          local_b8 = 0;
          if (0 < (int)local_108) {
            local_b8 = (ulong)local_108 & 0xffffffff;
          }
          pRVar25 = pRVar10;
          pRVar26 = local_100;
          for (uVar18 = 0; uVar18 != local_b8; uVar18 = uVar18 + 1) {
            for (uVar19 = 0; uVar1 != uVar19; uVar19 = uVar19 + 1) {
              lVar23 = (long)ref_mpi->n;
              lVar11 = (lVar29 + lVar23) / lVar23;
              lVar12 = pRVar26[uVar19] / lVar11;
              lVar13 = lVar29 / lVar23;
              lVar23 = (long)local_f8 - lVar23 * lVar13;
              if (lVar23 <= lVar12) {
                lVar12 = (pRVar26[uVar19] - lVar11 * lVar23) / lVar13 + lVar23;
              }
              pRVar25[uVar19] = (REF_INT)lVar12;
            }
            pRVar26 = pRVar26 + uVar6;
            pRVar25 = (REF_INT *)((long)pRVar25 + (long)local_c0);
          }
          local_80 = pRVar10;
          uVar4 = ref_cell_add_many_global
                            (local_88,local_78,(int)local_108,local_100,pRVar10,ref_mpi->id);
          if (uVar4 != 0) {
            pcVar24 = "glob";
            uVar17 = 0x50a;
            goto LAB_0016fbfe;
          }
          free(pRVar10);
          cVar7 = clock();
          local_c8 = (local_c8 - (long)local_d0) + cVar7;
        }
      } while (elements_to_receive != -1);
      local_f8 = 0.0;
LAB_0016f12c:
      free(local_100);
      ref_cell_00 = local_88;
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell read");
      }
      uVar4 = ref_migrate_shufflin_cell(local_78,ref_cell_00);
      if (uVar4 == 0) {
        if (ref_mpi->timing < 2) {
          return 0;
        }
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid cell shuffle");
        if (ref_mpi->timing < 2) {
          return 0;
        }
        total = (REF_INT)local_e8;
        uVar4 = ref_mpi_sum(ref_mpi,&total,&total_mpi,1,1);
        if (uVar4 == 0) {
          total = (REF_INT)local_c8;
          uVar4 = ref_mpi_sum(ref_mpi,&total,&total_add,1,1);
          if (uVar4 == 0) {
            if (ref_mpi->id != 0) {
              return 0;
            }
            printf(" read %f mpi %f add %f\n",local_f8 / 1000000.0,
                   ((double)total_mpi / 1000000.0) / (double)ref_mpi->n,
                   ((double)total_add / 1000000.0) / (double)ref_mpi->n);
            return 0;
          }
          pcVar24 = "sum";
          uVar17 = 0x51e;
        }
        else {
          pcVar24 = "sum";
          uVar17 = 0x51c;
        }
LAB_0016fb4a:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_bin_ugrid_cell",(ulong)uVar4,pcVar24);
        return uVar4;
      }
      pcVar24 = "fill ghosts";
      uVar17 = 0x515;
LAB_0016fbfe:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_bin_ugrid_cell",(ulong)uVar4,pcVar24);
      return uVar4;
    }
    if (-1 < (long)ref_mpi->n) {
      __size = (long)ref_mpi->n << 2;
      piVar14 = (int *)malloc(__size);
      if (piVar14 == (int *)0x0) {
        pcVar24 = "malloc elements_to_send of REF_INT NULL";
        uVar17 = 0x49f;
      }
      else {
        local_a8 = piVar14;
        local_108 = (undefined4 *)malloc(__size);
        if (local_108 != (undefined4 *)0x0) {
          local_e0 = (long *)malloc(sVar28);
          if (local_e0 == (long *)0x0) {
            pcVar24 = "malloc c2n of REF_GLOB NULL";
            uVar17 = 0x4a1;
          }
          else {
            local_40 = uVar18;
            local_c0 = malloc(uVar18 * 4);
            uVar6 = local_110;
            if (local_c0 != (void *)0x0) {
              local_c8 = 0;
              uVar18 = 0;
              if (0 < (int)uVar1) {
                uVar18 = (ulong)uVar1;
              }
              local_60 = local_e0 + lVar29;
              local_b8 = (long)local_f8 - 1;
              uVar19 = 0;
              if (0 < (int)local_110) {
                uVar19 = local_110 & 0xffffffff;
              }
              local_48 = lVar29 * 8;
              local_50 = lVar29 * 4;
              local_38 = local_110 * 4;
              local_e8 = 0;
              local_90 = 0;
              lVar11 = 0;
              local_d8 = ref_mpi;
              while (uVar21 = (long)local_80 - lVar11, uVar21 != 0 && lVar11 <= (long)local_80) {
                if ((long)local_40 <= (long)uVar21) {
                  uVar21 = local_40;
                }
                local_a0 = lVar11;
                local_98 = clock();
                local_128 = (uint)uVar21;
                uVar4 = uVar1 * local_128;
                uVar30 = (ulong)uVar4;
                if (sixty_four_bit == 0) {
                  if ((int)uVar4 < 0) {
                    pcVar24 = "malloc c2t of REF_INT negative";
                    uVar17 = 0x454;
                  }
                  else {
                    local_130 = malloc(uVar30 * 4);
                    pFVar9 = local_d0;
                    if (local_130 == (void *)0x0) {
                      pcVar24 = "malloc c2t of REF_INT NULL";
                      uVar17 = 0x454;
                      goto LAB_00170143;
                    }
                    local_b0 = local_a0 * 4;
                    iVar5 = fseeko(local_d0,local_b0 * lVar29 + local_58,0);
                    if (iVar5 != 0) {
                      sVar28 = (size_t)iVar5;
                      pcVar24 = "seek conn failed";
                      uVar17 = 0x458;
                      goto LAB_00170175;
                    }
                    sVar28 = fread(local_130,4,uVar30,pFVar9);
                    if (sVar28 != uVar30) {
                      pcVar24 = "cn";
                      uVar17 = 0x45b;
                      goto LAB_00170178;
                    }
                    for (lVar11 = 0; uVar30 * 4 - lVar11 != 0; lVar11 = lVar11 + 4) {
                      if (swap_endian != 0) {
                        uVar4 = *(uint *)((long)local_130 + lVar11);
                        *(uint *)((long)local_130 + lVar11) =
                             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18;
                      }
                    }
                    uVar30 = 0;
                    if (0 < (int)local_128) {
                      uVar30 = uVar21 & 0xffffffff;
                    }
                    pvVar15 = local_130;
                    plVar16 = local_e0;
                    for (uVar21 = 0; uVar21 != uVar30; uVar21 = uVar21 + 1) {
                      for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                        plVar16[uVar22] = (long)*(int *)((long)pvVar15 + uVar22 * 4) + -1;
                      }
                      plVar16 = plVar16 + uVar6;
                      pvVar15 = (void *)((long)pvVar15 + local_50);
                    }
                    if (uVar1 == (uint)local_110) goto LAB_0016f70a;
                    if ((int)local_128 < 0) {
                      pcVar24 = "malloc tag of REF_INT negative";
                      uVar17 = 0x466;
                    }
                    else {
                      local_f0 = (REF_INT *)(ulong)(local_128 & 0x7fffffff);
                      pvVar15 = malloc((long)local_f0 * 4);
                      pFVar9 = local_d0;
                      if (pvVar15 == (void *)0x0) {
                        pcVar24 = "malloc tag of REF_INT NULL";
                        uVar17 = 0x466;
                        goto LAB_00170143;
                      }
                      iVar5 = fseeko(local_d0,local_b0 + faceid_offset,0);
                      if (iVar5 != 0) {
                        sVar28 = (size_t)iVar5;
                        pcVar24 = "seek tag failed";
                        uVar17 = 0x46a;
                        goto LAB_00170175;
                      }
                      pRVar10 = (REF_INT *)fread(pvVar15,4,(size_t)local_f0,pFVar9);
                      if (pRVar10 == local_f0) {
                        for (pRVar10 = (REF_INT *)0x0; local_f0 != pRVar10;
                            pRVar10 = (REF_INT *)((long)pRVar10 + 1)) {
                          if (swap_endian != 0) {
                            uVar4 = *(uint *)((long)pvVar15 + (long)pRVar10 * 4);
                            *(uint *)((long)pvVar15 + (long)pRVar10 * 4) =
                                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                 uVar4 << 0x18;
                          }
                        }
                        plVar16 = local_60;
                        for (pRVar10 = (REF_INT *)0x0; local_f0 != pRVar10;
                            pRVar10 = (REF_INT *)((long)pRVar10 + 1)) {
                          *plVar16 = (long)*(int *)((long)pvVar15 + (long)pRVar10 * 4);
                          plVar16 = plVar16 + uVar6;
                        }
                        goto LAB_0016f700;
                      }
                      pcVar24 = "tag";
                      uVar17 = 0x46c;
                    }
                  }
LAB_001701a2:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar17,"ref_part_bin_ugrid_pack_cell",pcVar24);
LAB_001701a9:
                  uVar4 = 1;
LAB_001701ab:
                  pcVar24 = "read c2n";
                  uVar17 = 0x4ac;
                  goto LAB_0016fbfe;
                }
                if ((int)uVar4 < 0) {
                  pcVar24 = "malloc c2t of REF_LONG negative";
                  uVar17 = 0x430;
                  goto LAB_001701a2;
                }
                local_130 = malloc(uVar30 * 8);
                pFVar9 = local_d0;
                if (local_130 == (void *)0x0) {
                  pcVar24 = "malloc c2t of REF_LONG NULL";
                  uVar17 = 0x430;
LAB_00170143:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar17,"ref_part_bin_ugrid_pack_cell",pcVar24);
                  uVar4 = 2;
                  goto LAB_001701ab;
                }
                local_b0 = local_a0 * 8;
                iVar5 = fseeko(local_d0,local_b0 * lVar29 + local_58,0);
                if (iVar5 != 0) {
                  sVar28 = (size_t)iVar5;
                  pcVar24 = "seek conn failed";
                  uVar17 = 0x434;
LAB_00170175:
                  uVar30 = 0;
LAB_00170178:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar17,"ref_part_bin_ugrid_pack_cell",pcVar24,uVar30,sVar28);
                  goto LAB_001701a9;
                }
                sVar28 = fread(local_130,8,uVar30,pFVar9);
                if (sVar28 != uVar30) {
                  pcVar24 = "cn";
                  uVar17 = 0x437;
                  goto LAB_001701a2;
                }
                for (lVar11 = 0; uVar30 * 8 - lVar11 != 0; lVar11 = lVar11 + 8) {
                  if (swap_endian != 0) {
                    uVar22 = *(ulong *)((long)local_130 + lVar11);
                    *(ulong *)((long)local_130 + lVar11) =
                         uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                         (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                         (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                         (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38;
                  }
                }
                uVar30 = 0;
                if (0 < (int)local_128) {
                  uVar30 = uVar21 & 0xffffffff;
                }
                pvVar15 = local_130;
                plVar16 = local_e0;
                for (uVar21 = 0; uVar21 != uVar30; uVar21 = uVar21 + 1) {
                  for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                    plVar16[uVar22] = *(long *)((long)pvVar15 + uVar22 * 8) + -1;
                  }
                  plVar16 = plVar16 + uVar6;
                  pvVar15 = (void *)((long)pvVar15 + local_48);
                }
                if (uVar1 != (uint)local_110) {
                  if ((int)local_128 < 0) {
                    pcVar24 = "malloc tag of REF_LONG negative";
                    uVar17 = 0x442;
                  }
                  else {
                    local_f0 = (REF_INT *)(ulong)(local_128 & 0x7fffffff);
                    pvVar15 = malloc((long)local_f0 * 8);
                    pFVar9 = local_d0;
                    if (pvVar15 == (void *)0x0) {
                      pcVar24 = "malloc tag of REF_LONG NULL";
                      uVar17 = 0x442;
                      goto LAB_00170143;
                    }
                    iVar5 = fseeko(local_d0,local_b0 + faceid_offset,0);
                    if (iVar5 != 0) {
                      sVar28 = (size_t)iVar5;
                      pcVar24 = "seek tag failed";
                      uVar17 = 0x446;
                      goto LAB_00170175;
                    }
                    pRVar10 = (REF_INT *)fread(pvVar15,8,(size_t)local_f0,pFVar9);
                    if (pRVar10 == local_f0) {
                      for (pRVar10 = (REF_INT *)0x0; local_f0 != pRVar10;
                          pRVar10 = (REF_INT *)((long)pRVar10 + 1)) {
                        if (swap_endian != 0) {
                          uVar21 = *(ulong *)((long)pvVar15 + (long)pRVar10 * 8);
                          *(ulong *)((long)pvVar15 + (long)pRVar10 * 8) =
                               uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                               (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                               (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                               (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
                        }
                      }
                      plVar16 = local_60;
                      for (pRVar10 = (REF_INT *)0x0; local_f0 != pRVar10;
                          pRVar10 = (REF_INT *)((long)pRVar10 + 1)) {
                        *plVar16 = *(long *)((long)pvVar15 + (long)pRVar10 * 8);
                        plVar16 = plVar16 + uVar6;
                      }
LAB_0016f700:
                      free(pvVar15);
                      goto LAB_0016f70a;
                    }
                    pcVar24 = "tag";
                    uVar17 = 0x448;
                  }
                  goto LAB_001701a2;
                }
LAB_0016f70a:
                free(local_130);
                cVar7 = clock();
                pRVar20 = local_d8;
                plVar16 = local_e0;
                for (uVar21 = 0; uVar30 != uVar21; uVar21 = uVar21 + 1) {
                  lVar23 = (long)pRVar20->n;
                  lVar11 = (long)(local_b8 + lVar23) / lVar23;
                  lVar12 = *plVar16 / lVar11;
                  lVar13 = (long)local_f8 - lVar23 * ((long)local_b8 / lVar23);
                  if (lVar13 <= lVar12) {
                    lVar12 = (*plVar16 - lVar11 * lVar13) / ((long)local_b8 / lVar23) + lVar13;
                  }
                  *(int *)((long)local_c0 + uVar21 * 4) = (int)lVar12;
                  plVar16 = plVar16 + uVar6;
                  pRVar20 = ref_mpi;
                }
                local_90 = (local_90 - local_98) + cVar7;
                lVar11 = (long)pRVar20->n;
                for (lVar12 = 0; lVar12 < lVar11; lVar12 = lVar12 + 1) {
                  local_a8[lVar12] = 0;
                }
                for (uVar21 = 0; uVar30 != uVar21; uVar21 = uVar21 + 1) {
                  local_a8[*(int *)((long)local_c0 + uVar21 * 4)] =
                       local_a8[*(int *)((long)local_c0 + uVar21 * 4)] + 1;
                }
                *local_108 = 0;
                iVar5 = 0;
                for (lVar12 = 1; lVar12 < lVar11; lVar12 = lVar12 + 1) {
                  iVar5 = iVar5 + local_a8[lVar12 + -1];
                  local_108[lVar12] = iVar5;
                }
                for (lVar12 = 0; lVar12 < lVar11; lVar12 = lVar12 + 1) {
                  local_a8[lVar12] = 0;
                }
                plVar16 = local_e0;
                for (uVar21 = 0; uVar21 != uVar30; uVar21 = uVar21 + 1) {
                  iVar5 = *(int *)((long)local_c0 + uVar21 * 4);
                  iVar2 = local_a8[iVar5];
                  iVar3 = local_108[iVar5];
                  for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
                    local_100[(long)((iVar3 + iVar2) * (int)local_110) + uVar22] = plVar16[uVar22];
                  }
                  local_a8[iVar5] = iVar2 + 1;
                  plVar16 = plVar16 + uVar6;
                }
                local_a0 = local_a0 + (int)local_128;
                cVar7 = clock();
                lVar11 = 4;
                piVar14 = local_a8;
                pRVar20 = local_d8;
                for (lVar12 = 1; lVar12 < pRVar20->n; lVar12 = lVar12 + 1) {
                  if (0 < *(int *)((long)piVar14 + lVar11)) {
                    uVar4 = ref_mpi_scatter_send
                                      (pRVar20,(int *)((long)piVar14 + lVar11),1,1,(REF_INT)lVar12);
                    if (uVar4 == 0) {
                      uVar4 = ref_mpi_scatter_send
                                        (local_d8,local_100 +
                                                  (long)*(int *)((long)local_108 + lVar11) *
                                                  local_110,
                                         *(int *)((long)piVar14 + lVar11) * (int)local_110,2,
                                         (REF_INT)lVar12);
                      piVar14 = local_a8;
                      pRVar20 = local_d8;
                      if (uVar4 == 0) goto LAB_0016f931;
                      uVar17 = 0x4cf;
                    }
                    else {
                      uVar17 = 0x4cb;
                    }
                    pcVar24 = "send";
                    goto LAB_0016fbfe;
                  }
LAB_0016f931:
                  lVar11 = lVar11 + 4;
                }
                local_98 = clock();
                cVar8 = clock();
                iVar5 = *local_a8;
                if (0 < (long)iVar5) {
                  uVar4 = iVar5 * (int)local_110;
                  if ((int)uVar4 < 0) {
                    pcVar24 = "malloc sent_part of REF_INT negative";
                    uVar17 = 0x4d8;
                    goto LAB_0016f1b5;
                  }
                  local_b0 = cVar8;
                  pRVar10 = (REF_INT *)malloc((ulong)uVar4 * 4);
                  if (pRVar10 == (REF_INT *)0x0) {
                    uVar17 = 0x4d8;
LAB_0016fbc9:
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar17,"ref_part_bin_ugrid_cell","malloc sent_part of REF_INT NULL");
                    return 2;
                  }
                  for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
                    pRVar10[uVar21] = -1;
                  }
                  pRVar20 = local_d8;
                  pRVar25 = pRVar10;
                  pRVar26 = local_100;
                  for (lVar11 = 0; lVar11 != iVar5; lVar11 = lVar11 + 1) {
                    for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
                      lVar23 = (long)pRVar20->n;
                      lVar12 = (long)(local_b8 + lVar23) / lVar23;
                      lVar13 = pRVar26[uVar21] / lVar12;
                      lVar27 = (long)local_f8 - lVar23 * ((long)local_b8 / lVar23);
                      if (lVar27 <= lVar13) {
                        lVar13 = (pRVar26[uVar21] - lVar12 * lVar27) / ((long)local_b8 / lVar23) +
                                 lVar27;
                      }
                      pRVar25[uVar21] = (REF_INT)lVar13;
                      pRVar20 = ref_mpi;
                    }
                    pRVar26 = pRVar26 + uVar6;
                    pRVar25 = (REF_INT *)((long)pRVar25 + local_38);
                  }
                  local_f0 = pRVar10;
                  uVar4 = ref_cell_add_many_global
                                    (local_88,local_78,iVar5,local_100,pRVar10,pRVar20->id);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x4e1,"ref_part_bin_ugrid_cell",(ulong)uVar4,"glob");
                    return uVar4;
                  }
                  free(pRVar10);
                  cVar8 = local_b0;
                }
                local_e8 = (local_e8 - cVar7) + local_98;
                cVar7 = clock();
                local_c8 = (local_c8 - cVar8) + cVar7;
                lVar11 = local_a0;
              }
              free(local_c0);
              free(local_e0);
              free(local_108);
              free(local_a8);
              ref_mpi = local_d8;
              iVar5 = 1;
              do {
                if (ref_mpi->n <= iVar5) {
                  local_f8 = (double)local_90;
                  goto LAB_0016f12c;
                }
                uVar4 = ref_mpi_scatter_send(ref_mpi,&end_of_message,1,1,iVar5);
                iVar5 = iVar5 + 1;
              } while (uVar4 == 0);
              pcVar24 = "send";
              uVar17 = 0x4f0;
              goto LAB_0016fbfe;
            }
            pcVar24 = "malloc dest of REF_INT NULL";
            uVar17 = 0x4a2;
            local_c0 = (void *)0x0;
          }
          goto LAB_0016f1e6;
        }
        pcVar24 = "malloc start_to_send of REF_INT NULL";
        uVar17 = 0x4a0;
        local_108 = (undefined4 *)0x0;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_bin_ugrid_cell",pcVar24);
      return 2;
    }
    pcVar24 = "malloc elements_to_send of REF_INT negative";
    uVar17 = 0x49f;
  }
LAB_0016f1b5:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
         "ref_part_bin_ugrid_cell",pcVar24);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid_cell(
    REF_CELL ref_cell, REF_LONG ncell, REF_NODE ref_node, REF_GLOB nnode,
    FILE *file, REF_FILEPOS conn_offset, REF_FILEPOS faceid_offset,
    REF_BOOL swap_endian, REF_BOOL sixty_four_bit) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  clock_t tic;
  clock_t read_toc = 0;
  clock_t mpi_toc = 0;
  clock_t add_toc = 0;

  chunk = MAX(1000000, (REF_INT)(ncell / ref_mpi_n(ref_mpi)));

  if (1 < ref_mpi_timing(ref_mpi) && ref_mpi_once(ref_mpi))
    printf("chunk %d ncell %ld nproc %d\n", chunk, ncell, ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = (REF_INT)MIN((REF_LONG)chunk, ncell - ncell_read);

      tic = clock();
      RSS(ref_part_bin_ugrid_pack_cell(file, swap_endian, sixty_four_bit,
                                       conn_offset, faceid_offset, section_size,
                                       ncell_read, node_per, size_per, c2n),
          "read c2n");
      read_toc += (clock() - tic);
      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }
      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      tic = clock();
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
      mpi_toc += (clock() - tic);
      /* rank 0 keepers */

      tic = clock();
      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }
      add_toc += (clock() - tic);
    }

    ref_free(dest);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      tic = clock();
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      mpi_toc += (clock() - tic);
      if (elements_to_receive > 0) {
        tic = clock();
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");
        mpi_toc += (clock() - tic);

        tic = clock();
        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);
        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
        add_toc += (clock() - tic);
      }
    } while (elements_to_receive != end_of_message);
  }
  free(sent_c2n);

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell read");
  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid cell shuffle");

  if (1 < ref_mpi_timing(ref_mpi)) {
    REF_INT total, total_mpi, total_add;
    total = (REF_INT)mpi_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_mpi, 1, REF_INT_TYPE), "sum");
    total = (REF_INT)add_toc;
    RSS(ref_mpi_sum(ref_mpi, &total, &total_add, 1, REF_INT_TYPE), "sum");
    if (ref_mpi_once(ref_mpi))
      printf(" read %f mpi %f add %f\n",
             ((REF_DBL)read_toc) / ((REF_DBL)CLOCKS_PER_SEC),
             ((REF_DBL)total_mpi) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)),
             ((REF_DBL)total_add) / ((REF_DBL)CLOCKS_PER_SEC) /
                 ((REF_DBL)ref_mpi_n(ref_mpi)));
  }

  return REF_SUCCESS;
}